

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infomessages.cpp
# Opt level: O3

void __thiscall CInfoMessages::OnMessage(CInfoMessages *this,int MsgType,void *pRawMsg)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  IGraphics *pIVar4;
  CNetObj_GameDataRace *pCVar5;
  CSkins *this_00;
  CNetObj_GameDataFlag *pCVar6;
  IConsole *pIVar7;
  ITextRender *pIVar8;
  int iVar9;
  int v;
  CSkin *pCVar10;
  CGameClient *pCVar11;
  char *pcVar12;
  long lVar13;
  long in_FS_OFFSET;
  anon_union_4_2_94730227_for_vector4_base<float>_1 aVar14;
  undefined4 uVar15;
  anon_union_4_2_947300d3_for_vector4_base<float>_3 aVar16;
  uint uVar17;
  undefined8 uVar18;
  undefined4 uVar19;
  vec4 vVar20;
  char aDiff [32];
  char aLabel [64];
  char aTime [32];
  char aBuf [256];
  char aImprovement [64];
  CInfoMsg local_ae0;
  char local_7d8 [32];
  char local_7b8 [64];
  char local_778 [32];
  char local_758 [264];
  CInfoMsg local_650;
  CInfoMsg local_348;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar11 = (this->super_CComponent).m_pClient;
  if (pCVar11->m_SuppressEvents != false) goto LAB_001485b5;
  pIVar4 = pCVar11->m_pGraphics;
  uVar1 = pIVar4->m_ScreenWidth;
  uVar2 = pIVar4->m_ScreenHeight;
  (*(pIVar4->super_IInterface)._vptr_IInterface[5])
            (0,0,((float)(int)uVar1 / (float)(int)uVar2) * 1200.0 * 1.5,0x44e10000);
  pCVar11 = (this->super_CComponent).m_pClient;
  uVar17 = (pCVar11->m_GameInfo).m_GameFlags;
  if (MsgType == 0x23) {
    if ((uVar17 & 8) == 0) goto LAB_001485b5;
    pCVar5 = (pCVar11->m_Snap).m_pGameDataRace;
    if (pCVar5 == (CNetObj_GameDataRace *)0x0) {
      iVar9 = 3;
    }
    else {
      iVar9 = pCVar5->m_Precision;
    }
    FormatTime(local_778,0x20,*(int *)((long)pRawMsg + 4),iVar9);
    pCVar11 = (this->super_CComponent).m_pClient;
    CGameClient::GetPlayerLabel
              (pCVar11,local_7b8,0x40,*pRawMsg,pCVar11->m_aClients[*pRawMsg].m_aName);
    str_format(local_758,0x100,"%2d: %s: finished in %s",(long)*pRawMsg,
               ((this->super_CComponent).m_pClient)->m_aClients[*pRawMsg].m_aName,local_778);
    pIVar7 = ((this->super_CComponent).m_pClient)->m_pConsole;
    (*(pIVar7->super_IInterface)._vptr_IInterface[0x19])(pIVar7,0,"race",local_758,0);
    pcVar12 = "\'%s\' has set a new map record: %s";
    if (*(int *)((long)pRawMsg + 0xc) == 0) {
      if (*(int *)((long)pRawMsg + 0x10) != 0) goto LAB_00148140;
    }
    else {
      if (*(int *)((long)pRawMsg + 0x10) == 0) {
        pcVar12 = "\'%s\' has set a new personal record: %s";
      }
LAB_00148140:
      pcVar12 = Localize(pcVar12,"");
      str_format(local_758,0x100,pcVar12);
      if (*(int *)((long)pRawMsg + 8) < 0) {
        pCVar5 = (((this->super_CComponent).m_pClient)->m_Snap).m_pGameDataRace;
        if (pCVar5 == (CNetObj_GameDataRace *)0x0) {
          iVar9 = 3;
        }
        else {
          iVar9 = pCVar5->m_Precision;
        }
        FormatTimeDiff(local_7d8,0x20,-*(int *)((long)pRawMsg + 8),iVar9,false);
        pcVar12 = Localize(" (%s seconds faster)","");
        str_format((char *)&local_348,0x40,pcVar12);
        str_append(local_758,(char *)&local_348,0x100);
      }
      CChat::AddLine(((this->super_CComponent).m_pClient)->m_pChat,local_758,-1,0,-1);
    }
    pCVar5 = (((this->super_CComponent).m_pClient)->m_Snap).m_pGameDataRace;
    if ((pCVar5 != (CNetObj_GameDataRace *)0x0) && ((pCVar5->m_RaceFlags & 2) != 0)) {
      if ((*(int *)((long)pRawMsg + 0xc) == 0) && (*(int *)((long)pRawMsg + 0x10) == 0)) {
        pcVar12 = Localize("\'%s\' finished in: %s","");
        str_format(local_758,0x100,pcVar12,local_7b8,local_778);
        CChat::AddLine(((this->super_CComponent).m_pClient)->m_pChat,local_758,-1,0,-1);
      }
      goto LAB_001485b5;
    }
    CInfoMsg::CInfoMsg(&local_348);
    local_348.m_Player1ID = *pRawMsg;
    pCVar11 = (this->super_CComponent).m_pClient;
    memcpy(&local_348.m_Player1RenderInfo,&pCVar11->m_aClients[local_348.m_Player1ID].m_RenderInfo,
           0x9c);
    local_348.m_TimeCursor.m_FontSize = 36.0;
    if (*(int *)((long)pRawMsg + 0x10) == 0) {
      if (*(int *)((long)pRawMsg + 0xc) != 0) {
        uVar19 = 0x3f800000;
        uVar17 = 0x3f19999a;
        uVar15 = 0x3e4ccccd;
        goto LAB_00148337;
      }
    }
    else {
      uVar19 = 0;
      uVar17 = 0x3f000000;
      uVar15 = 0x3f800000;
LAB_00148337:
      (*(pCVar11->m_pTextRender->super_IInterface)._vptr_IInterface[4])
                (uVar15,(ulong)uVar17,uVar19,0x3f800000);
    }
    pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar8->super_IInterface)._vptr_IInterface[7])
              (pIVar8,&local_348.m_TimeCursor,local_778,0xffffffff);
    pCVar11 = (this->super_CComponent).m_pClient;
    if (pCVar11->m_pConfig->m_ClShowsocial != 0) {
      local_348.m_Player1NameCursor.m_FontSize = 36.0;
      (*(pCVar11->m_pTextRender->super_IInterface)._vptr_IInterface[7])
                (pCVar11->m_pTextRender,&local_348.m_Player1NameCursor,
                 pCVar11->m_aClients[*pRawMsg].m_aName,0xffffffff);
      pCVar11 = (this->super_CComponent).m_pClient;
    }
    pCVar5 = (pCVar11->m_Snap).m_pGameDataRace;
    if (pCVar5 == (CNetObj_GameDataRace *)0x0) {
      iVar9 = 3;
    }
    else {
      iVar9 = pCVar5->m_Precision;
    }
    FormatTimeDiff(local_778,0x20,*(int *)((long)pRawMsg + 8),iVar9,true);
    str_format(local_758,0x100,"(%s)",local_778);
    local_348.m_DiffCursor.m_FontSize = 36.0;
    uVar15 = 0x3f000000;
    uVar17 = 0x3f800000;
    if (-1 < *(int *)((long)pRawMsg + 8)) {
      uVar15 = 0x3f800000;
      uVar17 = 0x3f000000;
    }
    (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
              (uVar15,(ulong)uVar17);
    pIVar8 = ((this->super_CComponent).m_pClient)->m_pTextRender;
    (*(pIVar8->super_IInterface)._vptr_IInterface[7])
              (pIVar8,&local_348.m_DiffCursor,local_758,0xffffffff);
    (*(((this->super_CComponent).m_pClient)->m_pTextRender->super_IInterface)._vptr_IInterface[4])
              (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    local_348._552_8_ = *(undefined8 *)((long)pRawMsg + 4);
    local_348._768_8_ = *(undefined8 *)((long)pRawMsg + 0xc);
    CInfoMsg::CInfoMsg(&local_ae0,&local_348);
    AddInfoMsg(this,1,&local_ae0);
    if (local_ae0.m_DiffCursor.m_Glyphs.list != (CScaledGlyph *)0x0) {
      operator_delete__(local_ae0.m_DiffCursor.m_Glyphs.list);
    }
    local_ae0.m_DiffCursor.m_Glyphs.list = (CScaledGlyph *)0x0;
    if (local_ae0.m_TimeCursor.m_Glyphs.list != (CScaledGlyph *)0x0) {
      operator_delete__(local_ae0.m_TimeCursor.m_Glyphs.list);
    }
    local_ae0.m_TimeCursor.m_Glyphs.list = (CScaledGlyph *)0x0;
    if (local_ae0.m_Player2NameCursor.m_Glyphs.list != (CScaledGlyph *)0x0) {
      operator_delete__(local_ae0.m_Player2NameCursor.m_Glyphs.list);
    }
    local_ae0.m_Player2NameCursor.m_Glyphs.list = (CScaledGlyph *)0x0;
    if (local_ae0.m_Player1NameCursor.m_Glyphs.list != (CScaledGlyph *)0x0) {
      operator_delete__(local_ae0.m_Player1NameCursor.m_Glyphs.list);
    }
    local_ae0.m_Player1NameCursor.m_Glyphs.list = (CScaledGlyph *)0x0;
  }
  else {
    if ((MsgType != 5) ||
       ((((uVar17 & 8) != 0 &&
         (pCVar5 = (pCVar11->m_Snap).m_pGameDataRace, pCVar5 != (CNetObj_GameDataRace *)0x0)) &&
        ((pCVar5->m_RaceFlags & 1) != 0)))) goto LAB_001485b5;
    CInfoMsg::CInfoMsg(&local_348);
    local_348.m_Player1ID = *(int *)((long)pRawMsg + 4);
    pCVar11 = (this->super_CComponent).m_pClient;
    if (pCVar11->m_pConfig->m_ClShowsocial != 0) {
      local_348.m_Player1NameCursor.m_FontSize = 36.0;
      (*(pCVar11->m_pTextRender->super_IInterface)._vptr_IInterface[7])
                (pCVar11->m_pTextRender,&local_348.m_Player1NameCursor,
                 pCVar11->m_aClients[local_348.m_Player1ID].m_aName,0xffffffff);
      pCVar11 = (this->super_CComponent).m_pClient;
    }
    memcpy(&local_348.m_Player1RenderInfo,&pCVar11->m_aClients[local_348.m_Player1ID].m_RenderInfo,
           0x9c);
    uVar17 = *pRawMsg;
    local_348.m_Player2ID = uVar17;
    if ((long)(int)uVar17 < 0) {
      uVar3 = (pCVar11->m_GameInfo).m_GameFlags;
      iVar9 = CSkins::Find(pCVar11->m_pSkins,"dummy",false);
      pCVar11 = (this->super_CComponent).m_pClient;
      if (iVar9 != -1) {
        pCVar10 = CSkins::Get(pCVar11->m_pSkins,iVar9);
        iVar9 = 0;
        lVar13 = 0;
        do {
          *(undefined4 *)((long)&local_348.m_Player2RenderInfo.m_aTextures[0].m_Id + lVar13) =
               *(undefined4 *)(*(long *)((long)pCVar10->m_apParts + lVar13 * 2) + 0x68);
          this_00 = ((this->super_CComponent).m_pClient)->m_pSkins;
          if ((uVar3 & 1) == 0) {
            vVar20 = CSkins::GetColorV4(this_00,0,lVar13 == 4);
            uVar18 = vVar20._8_8_;
            aVar14 = vVar20.field_0;
            aVar16 = vVar20.field_1;
          }
          else {
            v = CSkins::GetTeamColor(this_00,0,0,~uVar17,iVar9);
            vVar20 = CSkins::GetColorV4(((this->super_CComponent).m_pClient)->m_pSkins,v,lVar13 == 4
                                       );
            uVar18 = vVar20._8_8_;
            aVar14 = vVar20.field_0;
            aVar16 = vVar20.field_1;
          }
          (&local_348.m_Player2RenderInfo.m_aColors[0].field_0)[lVar13] = aVar14;
          (&local_348.m_Player2RenderInfo.m_aColors[0].field_1)[lVar13] = aVar16;
          (&local_348.m_Player2RenderInfo.m_aColors[0].field_2)[lVar13] = SUB84(uVar18,0);
          (&local_348.m_Player2RenderInfo.m_aColors[0].field_3)[lVar13] =
               SUB84((ulong)uVar18 >> 0x20,0);
          (&local_348.m_Player2RenderInfo.m_aColors[0].field_3)[lVar13].w =
               (&local_348.m_Player2RenderInfo.m_aColors[0].field_3)[lVar13].w * 0.5;
          lVar13 = lVar13 + 4;
          iVar9 = iVar9 + 1;
        } while (lVar13 != 0x18);
        local_348.m_Player2RenderInfo.m_Size = 64.0;
        pCVar11 = (this->super_CComponent).m_pClient;
      }
    }
    else {
      if (pCVar11->m_pConfig->m_ClShowsocial != 0) {
        local_348.m_Player2NameCursor.m_FontSize = 36.0;
        (*(pCVar11->m_pTextRender->super_IInterface)._vptr_IInterface[7])
                  (pCVar11->m_pTextRender,&local_348.m_Player2NameCursor,
                   pCVar11->m_aClients[(int)uVar17].m_aName,0xffffffff);
        pCVar11 = (this->super_CComponent).m_pClient;
      }
      memcpy(&local_348.m_Player2RenderInfo,&pCVar11->m_aClients[local_348.m_Player2ID].m_RenderInfo
             ,0x9c);
    }
    local_348._540_8_ = *(undefined8 *)((long)pRawMsg + 8);
    pCVar6 = (pCVar11->m_Snap).m_pGameDataFlag;
    if (pCVar6 == (CNetObj_GameDataFlag *)0x0) {
      local_348.m_FlagCarrierBlue = -1;
    }
    else {
      local_348.m_FlagCarrierBlue = pCVar6->m_FlagCarrierBlue;
    }
    CInfoMsg::CInfoMsg(&local_650,&local_348);
    AddInfoMsg(this,0,&local_650);
    if (local_650.m_DiffCursor.m_Glyphs.list != (CScaledGlyph *)0x0) {
      operator_delete__(local_650.m_DiffCursor.m_Glyphs.list);
    }
    local_650.m_DiffCursor.m_Glyphs.list = (CScaledGlyph *)0x0;
    if (local_650.m_TimeCursor.m_Glyphs.list != (CScaledGlyph *)0x0) {
      operator_delete__(local_650.m_TimeCursor.m_Glyphs.list);
    }
    local_650.m_TimeCursor.m_Glyphs.list = (CScaledGlyph *)0x0;
    if (local_650.m_Player2NameCursor.m_Glyphs.list != (CScaledGlyph *)0x0) {
      operator_delete__(local_650.m_Player2NameCursor.m_Glyphs.list);
    }
    local_650.m_Player2NameCursor.m_Glyphs.list = (CScaledGlyph *)0x0;
    if (local_650.m_Player1NameCursor.m_Glyphs.list != (CScaledGlyph *)0x0) {
      operator_delete__(local_650.m_Player1NameCursor.m_Glyphs.list);
    }
    local_650.m_Player1NameCursor.m_Glyphs.list = (CScaledGlyph *)0x0;
  }
  if (local_348.m_DiffCursor.m_Glyphs.list != (CScaledGlyph *)0x0) {
    operator_delete__(local_348.m_DiffCursor.m_Glyphs.list);
  }
  local_348.m_DiffCursor.m_Glyphs.list = (CScaledGlyph *)0x0;
  if (local_348.m_TimeCursor.m_Glyphs.list != (CScaledGlyph *)0x0) {
    operator_delete__(local_348.m_TimeCursor.m_Glyphs.list);
  }
  local_348.m_TimeCursor.m_Glyphs.list = (CScaledGlyph *)0x0;
  if (local_348.m_Player2NameCursor.m_Glyphs.list != (CScaledGlyph *)0x0) {
    operator_delete__(local_348.m_Player2NameCursor.m_Glyphs.list);
  }
  local_348.m_Player2NameCursor.m_Glyphs.list = (CScaledGlyph *)0x0;
  if (local_348.m_Player1NameCursor.m_Glyphs.list != (CScaledGlyph *)0x0) {
    operator_delete__(local_348.m_Player1NameCursor.m_Glyphs.list);
  }
LAB_001485b5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CInfoMessages::OnMessage(int MsgType, void *pRawMsg)
{
	if(m_pClient->m_SuppressEvents)
		return;

	// hint TextRender to render text, deferred, with correct fontsize
	float Width = 400*3.0f*Graphics()->ScreenAspect();
	float Height = 400*3.0f;
	Graphics()->MapScreen(0, 0, Width*1.5f, Height*1.5f);

	bool Race = m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_RACE;

	if(MsgType == NETMSGTYPE_SV_KILLMSG)
	{
		if(Race && m_pClient->m_Snap.m_pGameDataRace && m_pClient->m_Snap.m_pGameDataRace->m_RaceFlags&RACEFLAG_HIDE_KILLMSG)
			return;

		CNetMsg_Sv_KillMsg *pMsg = (CNetMsg_Sv_KillMsg *)pRawMsg;

		// unpack messages
		CInfoMsg Kill;
		Kill.m_Player1ID = pMsg->m_Victim;
		if(Config()->m_ClShowsocial)
		{
			Kill.m_Player1NameCursor.m_FontSize = 36.0f;
			TextRender()->TextDeferred(&Kill.m_Player1NameCursor, m_pClient->m_aClients[Kill.m_Player1ID].m_aName, -1);
		}

		Kill.m_Player1RenderInfo = m_pClient->m_aClients[Kill.m_Player1ID].m_RenderInfo;

		Kill.m_Player2ID = pMsg->m_Killer;
		if(Kill.m_Player2ID >= 0)
		{
			if(Config()->m_ClShowsocial)
			{
				Kill.m_Player2NameCursor.m_FontSize = 36.0f;
				TextRender()->TextDeferred(&Kill.m_Player2NameCursor, m_pClient->m_aClients[Kill.m_Player2ID].m_aName, -1);
			}

			Kill.m_Player2RenderInfo = m_pClient->m_aClients[Kill.m_Player2ID].m_RenderInfo;
		}
		else
		{
			bool IsTeamplay = (m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_TEAMS) != 0;
			int KillerTeam = - 1 - Kill.m_Player2ID;
			int Skin = m_pClient->m_pSkins->Find("dummy", false);
			if(Skin != -1)
			{
				const CSkins::CSkin *pDummy = m_pClient->m_pSkins->Get(Skin);
				for(int p = 0; p < NUM_SKINPARTS; p++)
				{
					Kill.m_Player2RenderInfo.m_aTextures[p] = pDummy->m_apParts[p]->m_OrgTexture;
					if(IsTeamplay)
					{
						int ColorVal = m_pClient->m_pSkins->GetTeamColor(0, 0x000000, KillerTeam, p);
						Kill.m_Player2RenderInfo.m_aColors[p] = m_pClient->m_pSkins->GetColorV4(ColorVal, p==SKINPART_MARKING);
					}
					else
						Kill.m_Player2RenderInfo.m_aColors[p] = m_pClient->m_pSkins->GetColorV4(0x000000, p==SKINPART_MARKING);
					Kill.m_Player2RenderInfo.m_aColors[p].a *= .5f;
				}
				Kill.m_Player2RenderInfo.m_Size = 64.0f;
			}
		}

		Kill.m_Weapon = pMsg->m_Weapon;
		Kill.m_ModeSpecial = pMsg->m_ModeSpecial;
		Kill.m_FlagCarrierBlue = m_pClient->m_Snap.m_pGameDataFlag ? m_pClient->m_Snap.m_pGameDataFlag->m_FlagCarrierBlue : -1;

		AddInfoMsg(INFOMSG_KILL, Kill);
	}
	else if(MsgType == NETMSGTYPE_SV_RACEFINISH && Race)
	{
		CNetMsg_Sv_RaceFinish *pMsg = (CNetMsg_Sv_RaceFinish *)pRawMsg;

		char aBuf[256];
		char aTime[32];
		char aLabel[64];

		FormatTime(aTime, sizeof(aTime), pMsg->m_Time, m_pClient->RacePrecision());
		m_pClient->GetPlayerLabel(aLabel, sizeof(aLabel), pMsg->m_ClientID, m_pClient->m_aClients[pMsg->m_ClientID].m_aName);

		str_format(aBuf, sizeof(aBuf), "%2d: %s: finished in %s", pMsg->m_ClientID, m_pClient->m_aClients[pMsg->m_ClientID].m_aName, aTime);
		Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "race", aBuf);

		if(pMsg->m_RecordPersonal || pMsg->m_RecordServer)
		{
			if(pMsg->m_RecordServer)
				str_format(aBuf, sizeof(aBuf), Localize("'%s' has set a new map record: %s"), aLabel, aTime);
			else // m_RecordPersonal
				str_format(aBuf, sizeof(aBuf), Localize("'%s' has set a new personal record: %s"), aLabel, aTime);
			
			if(pMsg->m_Diff < 0)
			{
				char aImprovement[64];
				char aDiff[32];
				FormatTimeDiff(aDiff, sizeof(aDiff), absolute(pMsg->m_Diff), m_pClient->RacePrecision(), false);
				str_format(aImprovement, sizeof(aImprovement), Localize(" (%s seconds faster)"), aDiff);
				str_append(aBuf, aImprovement, sizeof(aBuf));
			}

			m_pClient->m_pChat->AddLine(aBuf);
		}

		if(m_pClient->m_Snap.m_pGameDataRace && m_pClient->m_Snap.m_pGameDataRace->m_RaceFlags&RACEFLAG_FINISHMSG_AS_CHAT)
		{
			if(!pMsg->m_RecordPersonal && !pMsg->m_RecordServer) // don't print the time twice
			{
				str_format(aBuf, sizeof(aBuf), Localize("'%s' finished in: %s"), aLabel, aTime);
				m_pClient->m_pChat->AddLine(aBuf);
			}
		}
		else
		{
			CInfoMsg Finish;
			Finish.m_Player1ID = pMsg->m_ClientID;
			Finish.m_Player1RenderInfo = m_pClient->m_aClients[Finish.m_Player1ID].m_RenderInfo;
			
			Finish.m_TimeCursor.m_FontSize = 36.0f;
			if(pMsg->m_RecordServer)
				TextRender()->TextColor(1.0f, 0.5f, 0.0f, 1.0f);
			else if(pMsg->m_RecordPersonal)
				TextRender()->TextColor(0.2f, 0.6f, 1.0f, 1.0f);
			TextRender()->TextDeferred(&Finish.m_TimeCursor, aTime, -1);

			if(Config()->m_ClShowsocial)
			{
				Finish.m_Player1NameCursor.m_FontSize = 36.0f;
				TextRender()->TextDeferred(&Finish.m_Player1NameCursor, m_pClient->m_aClients[pMsg->m_ClientID].m_aName, -1);
			}

			FormatTimeDiff(aTime, sizeof(aTime), pMsg->m_Diff, m_pClient->RacePrecision());
			str_format(aBuf, sizeof(aBuf), "(%s)", aTime);
			Finish.m_DiffCursor.m_FontSize = 36.0f;
			if(pMsg->m_Diff < 0)
				TextRender()->TextColor(0.5f, 1.0f, 0.5f, 1.0f);
			else
				TextRender()->TextColor(1.0f, 0.5f, 0.5f, 1.0f);
			TextRender()->TextDeferred(&Finish.m_DiffCursor, aBuf, -1);
			TextRender()->TextColor(1.0f, 1.0f, 1.0f, 1.0f);

			Finish.m_Time = pMsg->m_Time;
			Finish.m_Diff = pMsg->m_Diff;
			Finish.m_RecordPersonal = pMsg->m_RecordPersonal;
			Finish.m_RecordServer = pMsg->m_RecordServer;

			AddInfoMsg(INFOMSG_FINISH, Finish);
		}
	}
}